

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O2

Boolean MA_init(Integer datatype,Integer nominal_stack,Integer nominal_heap)

{
  long lVar1;
  char *pcVar2;
  ulong uVar3;
  size_t __size;
  ulong uVar4;
  
  ma_stats.calls[10] = ma_stats.calls[10] + 1;
  ma_preinitialize("MA_init");
  if (ma_initialized == '\x01') {
    builtin_strncpy(ma_ebuf,"MA already initialized",0x17);
  }
  else if (datatype - 1000U < 0x11) {
    uVar3 = 0x80000;
    uVar4 = 0x80000;
    if (-1 < nominal_heap) {
      lVar1 = (long)*(int *)(datatype * 4 + 0x1d03a0);
      uVar4 = lVar1 + nominal_heap * lVar1 + 0x65U & 0xfffffffffffffff8;
    }
    if (-1 < nominal_stack) {
      lVar1 = (long)*(int *)(datatype * 4 + 0x1d03a0);
      uVar3 = lVar1 + nominal_stack * lVar1 + 0x65U & 0xfffffffffffffff8;
    }
    __size = uVar3 + uVar4;
    pcVar2 = getenv("MA_USE_ARMCI_MEM");
    if (pcVar2 == (char *)0x0) {
      ma_segment = (Pointer)malloc(__size);
    }
    else {
      ma_segment = (Pointer)ARMCI_Malloc_local(__size);
    }
    if (ma_segment != (Pointer)0x0) {
      ma_initialized = 1;
      ma_hused = (AD *)0x0;
      ma_sused = (AD *)0x0;
      ma_hfree = (AD *)0x0;
      ma_hp = ma_segment;
      ma_sp = ma_segment + __size;
      ma_partition = ma_segment + uVar4;
      ma_eos = ma_segment + __size;
      return 1;
    }
    sprintf(ma_ebuf,"could not allocate %lu bytes",__size);
  }
  else {
    sprintf(ma_ebuf,"invalid datatype: %ld",datatype);
  }
  ma_error(EL_Nonfatal,ET_External,"MA_init",ma_ebuf);
  return 0;
}

Assistant:

public Boolean MA_init(
    Integer    datatype,    /* for computing storage requirement */
    Integer    nominal_stack,    /* # of datatype elements desired for stack */
    Integer    nominal_heap     /* # of datatype elements desired for heap */)
{
    ulongi    heap_bytes;    /* # of bytes for heap */
    ulongi    stack_bytes;    /* # of bytes for stack */
    ulongi    total_bytes;    /* total # of bytes */

#ifdef STATS
    ma_stats.calls[(int)FID_MA_init]++;
#endif /* STATS */

#ifdef VERIFY
    if (ma_auto_verify && !MA_verify_allocator_stuff())
        return MA_FALSE;
#endif /* VERIFY */

    /* preinitialize if necessary */
    ma_preinitialize("MA_init");

    /* verify uninitialization */
    if (ma_initialized)
    {
        (void)sprintf(ma_ebuf,
            "MA already initialized");
        ma_error(EL_Nonfatal, ET_External, "MA_init", ma_ebuf);
        return MA_FALSE;
    }

    /* verify datatype */
    if (!mt_valid(datatype))
    {
        (void)sprintf(ma_ebuf,
            "invalid datatype: %ld",
            (size_t)datatype);
        ma_error(EL_Nonfatal, ET_External, "MA_init", ma_ebuf);
        return MA_FALSE;
    }

    /* convert datatype to internal (index-suitable) value */
    datatype = mt_import(datatype);

    /* compute # of bytes in heap */
    if (nominal_heap < 0)
    {
        heap_bytes = DEFAULT_TOTAL_HEAP;
    }
    else
    {
        heap_bytes = (nominal_heap * ma_sizeof[datatype]) +
            (DEFAULT_REQUESTS_HEAP * max_block_overhead(datatype));
    }
    heap_bytes = (size_t)mai_round((size_t)heap_bytes, (ulongi)ALIGNMENT);

    /* compute # of bytes in stack */
    if (nominal_stack < 0)
    {
        stack_bytes = DEFAULT_TOTAL_STACK;
    }
    else
    {
        stack_bytes = (nominal_stack * ma_sizeof[datatype]) +
            (DEFAULT_REQUESTS_STACK * max_block_overhead(datatype));
    }
    stack_bytes = (size_t)mai_round((size_t)stack_bytes, (ulongi)ALIGNMENT);

    /* segment consists of heap and stack */
    total_bytes = heap_bytes + stack_bytes;
#ifdef NOUSE_MMAP
#if HAVE_MALLOPT
    /* disable memory mapped malloc */
    mallopt(M_MMAP_MAX, 0);
    mallopt(M_TRIM_THRESHOLD, -1);
#endif
#endif
    /* allocate the segment of memory */
#ifdef ENABLE_CUDA_MEM
    if(getenv("MA_USE_CUDA_MEM"))
    {
        void * temp_ptr = NULL;
        int cuda_error = 0;                  // cudaSuccess 0
        unsigned int cuda_mem_flags = 0x01;  // cudaMemAttachGlobal 0x01
        cuda_error = cudaMallocManaged(&temp_ptr, total_bytes, cuda_mem_flags);
        if (cuda_error == 0) {
          ma_segment = temp_ptr;
        } else {
          ma_segment = NULL;
        }
    }
    else
#elif defined(ENABLE_ARMCI_MEM_OPTION)
    if(getenv("MA_USE_ARMCI_MEM"))
    {
        ma_segment = (Pointer)ARMCI_Malloc_local(total_bytes);
    }
    else
#endif
    {
        ma_segment = (Pointer)bytealloc(total_bytes);
    }
    if (ma_segment == (Pointer)NULL)
    {
        (void)sprintf(ma_ebuf,
            "could not allocate %lu bytes",
            total_bytes);
        ma_error(EL_Nonfatal, ET_External, "MA_init", ma_ebuf);
        return MA_FALSE;
    }

    /*
     * initialize management stuff
     */

    /* partition is at (first address past) end of heap */
    ma_partition = ma_segment + heap_bytes;
    /* compute (first address past) end of segment */
    ma_eos = ma_segment + total_bytes;
    /* ma_hp initially points at start of segment */
    ma_hp = ma_segment;
    /* ma_sp initially points at end of segment */
    ma_sp = ma_eos;

    /* lists are all initially empty */
    ma_hfree = (AD *)NULL;
    ma_hused = (AD *)NULL;
    ma_sused = (AD *)NULL;

    /* we are now initialized */
    ma_initialized = MA_TRUE;

    /* success */
    return MA_TRUE;
}